

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *pIVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ImGuiContext *unaff_retaddr;
  int child_n;
  ImGuiDockNode *dst_node;
  ImGuiContext *ctx;
  uint *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  ImGuiContext *out_node_remap_pairs_00;
  undefined4 in_stack_fffffffffffffff0;
  
  out_node_remap_pairs_00 = GImGui;
  pIVar1 = ImGui::DockContextAddNode(unaff_retaddr,(ImGuiID)((ulong)in_RDI >> 0x20));
  pIVar1->SharedFlags = *(ImGuiDockNodeFlags *)(in_RDI + 4);
  pIVar1->LocalFlags = *(ImGuiDockNodeFlags *)(in_RDI + 8);
  pIVar1->Pos = *(ImVec2 *)(in_RDI + 0x40);
  pIVar1->Size = *(ImVec2 *)(in_RDI + 0x48);
  pIVar1->SizeRef = *(ImVec2 *)(in_RDI + 0x50);
  pIVar1->SplitAxis = *(int *)(in_RDI + 0x58);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,in_stack_ffffffffffffffc8);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,in_stack_ffffffffffffffc8);
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    if (*(long *)(in_RDI + 0x18 + (long)iVar3 * 8) != 0) {
      pIVar2 = DockBuilderCopyNodeRec
                         ((ImGuiDockNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (ImGuiID)((ulong)in_RDX >> 0x20),
                          (ImVector<unsigned_int> *)out_node_remap_pairs_00);
      pIVar1->ChildNodes[iVar3] = pIVar2;
      pIVar1->ChildNodes[iVar3]->ParentNode = pIVar1;
    }
  }
  return pIVar1;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}